

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack8to1_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  int *piVar14;
  uint uVar15;
  undefined4 *puVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  int iVar20;
  undefined4 *puVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  uint uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  undefined8 *puVar27;
  int nn;
  int iVar28;
  undefined8 *puVar29;
  uint uVar30;
  undefined4 *puVar31;
  long lVar32;
  ulong uVar33;
  undefined4 *puVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 local_98 [64];
  size_t local_58;
  ulong local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  uVar1 = bottom_im2col->w;
  uVar33 = (ulong)(int)uVar1;
  iVar20 = bottom_im2col->h;
  uVar15 = bottom_im2col->c;
  iVar2 = top_blob->c;
  local_58 = 0;
  local_98._16_8_ = 0;
  local_98._24_4_ = 0;
  local_98._0_8_ = (undefined1 (*) [16])0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_98._32_8_ = (Allocator *)0x0;
  local_98._40_4_ = 0;
  local_98._44_4_ = 0;
  uVar24 = (uVar1 & 1) + (uVar1 >> 1);
  if ((long)uVar33 < 2) {
    uVar24 = uVar1;
  }
  Mat::create((Mat *)local_98,iVar20 << (1 < (long)uVar33),uVar15,uVar24,8,8,
              opt->workspace_allocator);
  if (0 < (int)uVar1 >> 1) {
    lVar17 = 0;
    uVar22 = 0;
    do {
      if (0 < (int)uVar15) {
        puVar29 = (undefined8 *)((undefined1 *)local_98._0_8_ + local_58 * uVar22 * local_98._16_8_)
        ;
        uVar25 = 0;
        do {
          if (0 < iVar20) {
            puVar27 = (undefined8 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + lVar17);
            iVar28 = iVar20;
            do {
              uVar13 = puVar27[1];
              *puVar29 = *puVar27;
              puVar29[1] = uVar13;
              puVar29 = puVar29 + 2;
              puVar27 = puVar27 + uVar1;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar15);
      }
      uVar22 = uVar22 + 1;
      lVar17 = lVar17 + 0x10;
    } while (uVar22 != (uint)((int)uVar1 >> 1));
  }
  uVar22 = uVar33 & 0xfffffffffffffffe;
  if ((uint)uVar22 != uVar1) {
    pvVar18 = (void *)(uVar22 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar15) {
        uVar24 = ((uint)(uVar22 >> 0x1f) & 1) + (int)uVar22;
        puVar29 = (undefined8 *)
                  ((undefined1 *)local_98._0_8_ +
                  (long)(int)(((int)uVar24 >> 1) + ((int)uVar22 - (uVar24 & 0xfffffffe))) * local_58
                  * local_98._16_8_);
        uVar25 = 0;
        do {
          if (0 < iVar20) {
            puVar27 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + (long)pvVar18);
            iVar28 = iVar20;
            do {
              *puVar29 = *puVar27;
              puVar29 = puVar29 + 1;
              puVar27 = puVar27 + uVar33;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar15);
      }
      uVar22 = uVar22 + 1;
      pvVar18 = (void *)((long)pvVar18 + 8);
    } while ((long)uVar22 < (long)uVar33);
  }
  if (0 < iVar2 >> 2) {
    local_38 = top_blob->data;
    local_40 = top_blob->elemsize * top_blob->cstep;
    pauVar26 = (undefined1 (*) [16])kernel->data;
    local_48 = kernel->elemsize * kernel->cstep;
    local_50 = (ulong)(uint)(iVar2 >> 2);
    uVar22 = 0;
    do {
      puVar34 = (undefined4 *)(uVar22 * 4 * local_40 + (long)local_38);
      puVar21 = (undefined4 *)((uVar22 * 4 + 1) * local_40 + (long)local_38);
      puVar16 = (undefined4 *)((uVar22 * 4 + 2) * local_40 + (long)local_38);
      puVar31 = (undefined4 *)((uVar22 * 4 + 3) * local_40 + (long)local_38);
      if ((int)uVar1 < 2) {
        uVar25 = 0;
      }
      else {
        uVar19 = 0;
        pauVar23 = (undefined1 (*) [16])local_98._0_8_;
        do {
          if (0 < (int)(uVar15 * iVar20)) {
            auVar38 = *pauVar23;
            auVar35 = vpcmpgtb_avx((undefined1  [16])0x0,auVar38);
            vpunpcklbw_avx(auVar38,auVar35);
            vpunpckhbw_avx(auVar38,auVar35);
            auVar38 = *pauVar26;
            auVar35 = pauVar26[1];
            auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar38);
            auVar7 = vpcmpgtb_avx((undefined1  [16])0x0,auVar35);
            vpunpcklbw_avx(auVar38,auVar6);
            vpunpckhbw_avx(auVar38,auVar6);
            vpunpcklbw_avx(auVar35,auVar7);
            vpunpckhbw_avx(auVar35,auVar7);
            halt_baddata();
          }
          auVar38 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar9 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar35 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar6 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar10 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar11 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar7 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar12 = vpunpcklqdq_avx(auVar38,auVar9);
          auVar38 = vpunpckhqdq_avx(auVar38,auVar9);
          auVar38 = vpaddd_avx(auVar12,auVar38);
          auVar9 = vpunpcklqdq_avx(auVar35,auVar6);
          auVar35 = vpunpckhqdq_avx(auVar35,auVar6);
          auVar35 = vpaddd_avx(auVar35,auVar9);
          auVar38 = vpaddd_avx(auVar38,auVar35);
          auVar6 = vpunpcklqdq_avx(auVar10,auVar11);
          auVar35 = vpunpckhqdq_avx(auVar10,auVar11);
          auVar35 = vpaddd_avx(auVar6,auVar35);
          auVar6 = vpunpcklqdq_avx(auVar7,auVar8);
          *puVar34 = auVar38._0_4_;
          *puVar21 = auVar38._4_4_;
          *puVar16 = auVar38._8_4_;
          *puVar31 = auVar38._12_4_;
          auVar38 = vpunpckhqdq_avx(auVar7,auVar8);
          auVar38 = vpaddd_avx(auVar38,auVar6);
          auVar38 = vpaddd_avx(auVar35,auVar38);
          puVar34[1] = auVar38._0_4_;
          puVar21[1] = auVar38._4_4_;
          puVar16[1] = auVar38._8_4_;
          puVar31[1] = auVar38._12_4_;
          puVar34 = puVar34 + 2;
          puVar21 = puVar21 + 2;
          puVar16 = puVar16 + 2;
          puVar31 = puVar31 + 2;
          uVar25 = uVar19 + 2;
          lVar17 = uVar19 + 3;
          pauVar23 = (undefined1 (*) [16])(*pauVar23 + local_98._16_8_ * local_58);
          uVar19 = uVar25;
        } while (lVar17 < (long)uVar33);
      }
      if ((int)uVar25 < (int)uVar1) {
        do {
          if (0 < (int)(uVar15 * iVar20)) {
            auVar38._8_8_ = 0;
            auVar38._0_8_ =
                 *(ulong *)((undefined1 *)local_98._0_8_ +
                           (ulong)(((uint)uVar25 & 1) + ((uint)(uVar25 >> 1) & 0x7fffffff)) *
                           local_98._16_8_ * local_58);
            vpmovsxbw_avx(auVar38);
            auVar38 = *pauVar26;
            auVar35 = pauVar26[1];
            auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar38);
            auVar7 = vpcmpgtb_avx((undefined1  [16])0x0,auVar35);
            vpunpcklbw_avx(auVar38,auVar6);
            vpunpckhbw_avx(auVar38,auVar6);
            vpunpcklbw_avx(auVar35,auVar7);
            vpunpckhbw_avx(auVar35,auVar7);
            halt_baddata();
          }
          auVar38 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar7 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar35 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar6 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpcklqdq_avx(auVar38,auVar7);
          auVar38 = vpunpckhqdq_avx(auVar38,auVar7);
          auVar38 = vpaddd_avx(auVar8,auVar38);
          auVar7 = vpunpcklqdq_avx(auVar35,auVar6);
          auVar35 = vpunpckhqdq_avx(auVar35,auVar6);
          auVar35 = vpaddd_avx(auVar35,auVar7);
          auVar38 = vpaddd_avx(auVar38,auVar35);
          *puVar34 = auVar38._0_4_;
          *puVar21 = auVar38._4_4_;
          *puVar16 = auVar38._8_4_;
          *puVar31 = auVar38._12_4_;
          puVar34 = puVar34 + 1;
          puVar21 = puVar21 + 1;
          puVar16 = puVar16 + 1;
          puVar31 = puVar31 + 1;
          uVar24 = (uint)uVar25 + 1;
          uVar25 = (ulong)uVar24;
        } while (uVar24 != uVar1);
      }
      uVar22 = uVar22 + 1;
      pauVar26 = (undefined1 (*) [16])(*pauVar26 + local_48);
    } while (uVar22 != local_50);
  }
  uVar22 = (long)iVar2 & 0xfffffffffffffffc;
  if ((int)uVar22 != iVar2) {
    pvVar18 = top_blob->data;
    sVar3 = top_blob->elemsize;
    sVar4 = top_blob->cstep;
    pvVar5 = kernel->data;
    lVar17 = kernel->elemsize * kernel->cstep;
    iVar20 = uVar15 * iVar20;
    do {
      puVar29 = (undefined8 *)(sVar3 * sVar4 * uVar22 + (long)pvVar18);
      uVar15 = (uint)uVar22;
      if ((int)uVar1 < 2) {
        uVar25 = 0;
      }
      else {
        uVar24 = uVar15 + 3;
        if (-1 < (int)uVar15) {
          uVar24 = uVar15;
        }
        uVar19 = 0;
        do {
          if (iVar20 < 1) {
            auVar38 = (undefined1  [16])0x0;
            auVar35 = (undefined1  [16])0x0;
          }
          else {
            pauVar26 = (undefined1 (*) [16])
                       ((undefined1 *)local_98._0_8_ + (uVar19 >> 1) * local_98._16_8_ * local_58);
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            lVar32 = 0;
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            auVar40 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar38 = *pauVar26;
              auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar38);
              auVar7 = vpunpcklbw_avx(auVar38,auVar6);
              auVar35._8_8_ = 0;
              auVar35._0_8_ =
                   *(ulong *)((long)pvVar5 +
                             lVar32 * 8 +
                             (int)(((int)uVar24 >> 2) + (uVar15 - (uVar24 & 0xfffffffc))) * lVar17);
              auVar35 = vpmovsxbw_avx(auVar35);
              auVar38 = vpunpckhbw_avx(auVar38,auVar6);
              auVar8 = vpmullw_avx(auVar35,auVar7);
              auVar6 = vpmulhw_avx(auVar35,auVar7);
              auVar9 = vpmullw_avx(auVar35,auVar38);
              auVar7 = vpmulhw_avx(auVar35,auVar38);
              auVar38 = vpunpcklwd_avx(auVar8,auVar6);
              auVar38 = vpaddd_avx(auVar38,auVar40._0_16_);
              auVar40 = ZEXT1664(auVar38);
              auVar35 = vpunpckhwd_avx(auVar8,auVar6);
              auVar35 = vpaddd_avx(auVar39._0_16_,auVar35);
              auVar39 = ZEXT1664(auVar35);
              auVar6 = vpunpcklwd_avx(auVar9,auVar7);
              auVar6 = vpaddd_avx(auVar37._0_16_,auVar6);
              auVar37 = ZEXT1664(auVar6);
              auVar7 = vpunpckhwd_avx(auVar9,auVar7);
              auVar7 = vpaddd_avx(auVar36._0_16_,auVar7);
              auVar36 = ZEXT1664(auVar7);
              pauVar26 = pauVar26 + 1;
              lVar32 = lVar32 + 1;
            } while (iVar20 != (int)lVar32);
            auVar38 = vpaddd_avx(auVar35,auVar38);
            auVar35 = vpaddd_avx(auVar7,auVar6);
          }
          auVar6 = vpshufd_avx(auVar38,0xee);
          auVar38 = vpaddd_avx(auVar38,auVar6);
          auVar6 = vpshufd_avx(auVar35,0xee);
          auVar35 = vpaddd_avx(auVar35,auVar6);
          auVar38 = vphaddd_avx(auVar38,auVar35);
          auVar38 = vpshufd_avx(auVar38,0xe8);
          *puVar29 = auVar38._0_8_;
          puVar29 = puVar29 + 1;
          uVar25 = uVar19 + 2;
          lVar32 = uVar19 + 3;
          uVar19 = uVar25;
        } while (lVar32 < (long)uVar33);
      }
      if ((int)uVar25 < (int)uVar1) {
        uVar24 = uVar15 + 3;
        if (-1 < (int)uVar15) {
          uVar24 = uVar15;
        }
        do {
          if (iVar20 < 1) {
            auVar38 = (undefined1  [16])0x0;
          }
          else {
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            lVar32 = 0;
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)((undefined1 *)local_98._0_8_ +
                                       lVar32 * 8 +
                                       (ulong)(((uint)uVar25 & 1) +
                                              ((uint)(uVar25 >> 1) & 0x7fffffff)) *
                                       local_98._16_8_ * local_58);
              auVar38 = vpmovsxbw_avx(auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)((long)pvVar5 +
                                       lVar32 * 8 +
                                       (int)(((int)uVar24 >> 2) + (uVar15 - (uVar24 & 0xfffffffc)))
                                       * lVar17);
              auVar35 = vpmovsxbw_avx(auVar7);
              auVar6 = vpmullw_avx(auVar35,auVar38);
              auVar35 = vpmulhw_avx(auVar38,auVar35);
              auVar38 = vpunpcklwd_avx(auVar6,auVar35);
              auVar38 = vpaddd_avx(auVar37._0_16_,auVar38);
              auVar37 = ZEXT1664(auVar38);
              auVar35 = vpunpckhwd_avx(auVar6,auVar35);
              auVar35 = vpaddd_avx(auVar36._0_16_,auVar35);
              auVar36 = ZEXT1664(auVar35);
              lVar32 = lVar32 + 1;
            } while (iVar20 != (int)lVar32);
            auVar38 = vpaddd_avx(auVar35,auVar38);
          }
          auVar38 = vphaddd_avx(auVar38,auVar38);
          auVar38 = vphaddd_avx(auVar38,auVar38);
          *(int *)puVar29 = auVar38._0_4_;
          puVar29 = (undefined8 *)((long)puVar29 + 4);
          uVar30 = (uint)uVar25 + 1;
          uVar25 = (ulong)uVar30;
        } while (uVar30 != uVar1);
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)iVar2);
  }
  piVar14 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_98._0_8_ != (undefined1 (*) [16])0x0) {
          free((void *)local_98._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_98._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}